

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.h
# Opt level: O0

void __thiscall Jinx::Impl::Parser::Error<char_const*>(Parser *this,char *format,char **args)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  pointer pSVar4;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_28;
  char **local_20;
  char **args_local;
  char *format_local;
  Parser *this_local;
  
  if ((this->m_error & 1U) == 0) {
    this->m_error = true;
    local_20 = args;
    args_local = (char **)format;
    format_local = (char *)this;
    bVar2 = std::__cxx11::
            basic_string<char,_std::char_traits<char>,_Jinx::StaticAllocator<char,_8192UL,_16UL>_>::
            empty(&this->m_name);
    if (bVar2) {
      LogWrite(Error,"Error at ");
    }
    else {
      pcVar3 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_Jinx::StaticAllocator<char,_8192UL,_16UL>_>
               ::c_str(&this->m_name);
      LogWrite(Error,"Error in %s at ",pcVar3);
    }
    local_28._M_current =
         (Symbol *)
         std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end
                   (this->m_symbolList);
    bVar2 = __gnu_cxx::operator==(&this->m_currentSymbol,&local_28);
    if (bVar2) {
      LogWrite(Error,"end of script: ");
    }
    else {
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&this->m_currentSymbol);
      uVar1 = pSVar4->lineNumber;
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
               ::operator->(&this->m_currentSymbol);
      LogWrite(Error,"line %i, column %i: ",(ulong)uVar1,(ulong)pSVar4->columnNumber);
    }
    LogWriteLine(Error,(char *)args_local,*local_20);
    ErrorWriteDetails(this);
  }
  return;
}

Assistant:

void Error(const char * format, Args&&... args)
		{
			if (m_error)
				return;
			m_error = true;

			// Write error message and location
			if (m_name.empty())
				LogWrite(LogLevel::Error, "Error at ");
			else
				LogWrite(LogLevel::Error, "Error in %s at ", m_name.c_str());
			if (m_currentSymbol == m_symbolList.end())
				LogWrite(LogLevel::Error, "end of script: ");
			else
				LogWrite(LogLevel::Error, "line %i, column %i: ", m_currentSymbol->lineNumber, m_currentSymbol->columnNumber);
			LogWriteLine(LogLevel::Error, format, std::forward<Args>(args)...);

			// Write out the line of code containing the error, and a second line
			// that points out the location of the error
			ErrorWriteDetails();
		}